

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void opj_t1_clbl_decode_processor(void *user_data,opj_tls_t *tls)

{
  OPJ_UINT32 *pOVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  opj_tcd_cblk_dec_t *cblk;
  int *piVar7;
  opj_event_mgr_t *p_manager;
  opj_mutex_t *p_manager_mutex;
  float *pfVar8;
  opj_tcd_seg_t *poVar9;
  opj_mqc_state_t *poVar10;
  OPJ_BYTE *pOVar11;
  byte *pbVar12;
  bool bVar13;
  OPJ_BOOL OVar14;
  OPJ_BOOL OVar15;
  int iVar16;
  OPJ_INT32 *pOVar17;
  opj_t1_t *p_t1;
  OPJ_BYTE *pOVar18;
  float *pfVar19;
  uint *puVar20;
  uint *puVar21;
  byte bVar22;
  float fVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  OPJ_UINT32 OVar33;
  ulong uVar34;
  opj_flag_t *flagsp;
  float fVar35;
  uint uVar36;
  long lVar37;
  opj_mqc_state_t **ppoVar38;
  int iVar39;
  OPJ_UINT32 OVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  ulong uVar45;
  uint *puVar46;
  ulong uVar47;
  ulong uVar48;
  uint uVar49;
  uint uVar50;
  size_t size;
  uint *puVar51;
  opj_mqc_t *mqc;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  float fVar55;
  uint local_f4;
  uint local_bc;
  OPJ_INT32 *local_70;
  
  cblk = *(opj_tcd_cblk_dec_t **)((long)user_data + 8);
  if (*user_data == 0) {
    size = (ulong)(uint)(cblk->y1 - cblk->y0) * (ulong)(uint)(cblk->x1 - cblk->x0) * 4;
    pOVar17 = (OPJ_INT32 *)opj_aligned_malloc(size);
    cblk->decoded_data = pOVar17;
    if (pOVar17 != (OPJ_INT32 *)0x0) {
      memset(pOVar17,0,size);
      goto LAB_0012d848;
    }
    if (*(opj_mutex_t **)((long)user_data + 0x40) != (opj_mutex_t *)0x0) {
      opj_mutex_lock(*(opj_mutex_t **)((long)user_data + 0x40));
    }
    opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                  "Cannot allocate cblk->decoded_data\n");
    if (*(opj_mutex_t **)((long)user_data + 0x40) != (opj_mutex_t *)0x0) {
      opj_mutex_unlock(*(opj_mutex_t **)((long)user_data + 0x40));
    }
    goto LAB_0012dfe9;
  }
  if (cblk->decoded_data != (OPJ_INT32 *)0x0) {
    opj_aligned_free(cblk->decoded_data);
    cblk->decoded_data = (OPJ_INT32 *)0x0;
  }
LAB_0012d848:
  iVar3 = *(int *)((long)user_data + 4);
  piVar7 = *(int **)((long)user_data + 0x10);
  lVar27 = *(long *)((long)user_data + 0x18);
  lVar37 = *(long *)((long)user_data + 0x20);
  lVar26 = (ulong)(*(int *)(lVar27 + 0x18) - 1) * 0xc0;
  iVar4 = *(int *)(*(long *)(lVar27 + 0x20) + 8 + lVar26);
  iVar5 = *(int *)(*(long *)(lVar27 + 0x20) + lVar26);
  if (**(int **)((long)user_data + 0x30) == 0) goto LAB_0012dff7;
  p_t1 = (opj_t1_t *)opj_tls_get(tls,0);
  if (p_t1 == (opj_t1_t *)0x0) {
    p_t1 = (opj_t1_t *)opj_calloc(1,0x110);
    if (p_t1 == (opj_t1_t *)0x0) {
      p_t1 = (opj_t1_t *)0x0;
    }
    else {
      p_t1->encoder = 0;
    }
    if (p_t1 == (opj_t1_t *)0x0) {
      opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                    "Cannot allocate Tier 1 handle\n");
    }
    else {
      OVar15 = opj_tls_set(tls,0,p_t1,opj_t1_destroy_wrapper);
      if (OVar15 != 0) goto LAB_0012d8bd;
      opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                    "Unable to set t1 handle as TLS\n");
      opj_t1_destroy(p_t1);
    }
    goto LAB_0012dfe9;
  }
LAB_0012d8bd:
  p_t1->mustuse_cblkdatabuffer = *(OPJ_BOOL *)((long)user_data + 0x28);
  uVar28 = *(uint *)(lVar37 + 0x10);
  OVar33 = *(OPJ_UINT32 *)(lVar37 + 0x328);
  p_manager = *(opj_event_mgr_t **)((long)user_data + 0x38);
  p_manager_mutex = *(opj_mutex_t **)((long)user_data + 0x40);
  OVar15 = *(OPJ_BOOL *)((long)user_data + 0x48);
  if ((uVar28 & 0x40) == 0) {
    (p_t1->mqc).lut_ctxno_zc_orient = "" + (uint)(piVar7[4] << 9);
    OVar14 = opj_t1_allocate_buffers(p_t1,cblk->x1 - cblk->x0,cblk->y1 - cblk->y0);
    if (OVar14 != 0) {
      local_f4 = OVar33 + cblk->numbps;
      if ((int)local_f4 < 0x1f) {
        opj_mqc_resetstates(&p_t1->mqc);
        uVar32 = 0;
        opj_mqc_setstate(&p_t1->mqc,0x12,0,0x2e);
        opj_mqc_setstate(&p_t1->mqc,0x11,0,3);
        opj_mqc_setstate(&p_t1->mqc,0,0,4);
        uVar48 = (ulong)cblk->numchunks;
        if ((uVar48 < 2) && (p_t1->mustuse_cblkdatabuffer == 0)) {
          if (cblk->numchunks != 1) goto LAB_0012d9bf;
          pOVar18 = cblk->chunks->data;
        }
        else {
          if (uVar48 != 0) {
            lVar26 = 0;
            uVar32 = 0;
            do {
              uVar32 = uVar32 + *(int *)((long)&cblk->chunks->len + lVar26);
              lVar26 = lVar26 + 0x10;
            } while (uVar48 << 4 != lVar26);
          }
          uVar30 = uVar32 + 2;
          if (p_t1->cblkdatabuffersize < uVar30) {
            pOVar18 = (OPJ_BYTE *)opj_realloc(p_t1->cblkdatabuffer,(ulong)uVar30);
            if (pOVar18 != (OPJ_BYTE *)0x0) {
              p_t1->cblkdatabuffer = pOVar18;
              (pOVar18 + uVar32)[0] = '\0';
              (pOVar18 + uVar32)[1] = '\0';
              p_t1->cblkdatabuffersize = uVar30;
              goto LAB_0012dc12;
            }
            pOVar18 = (OPJ_BYTE *)0x0;
            bVar13 = false;
          }
          else {
LAB_0012dc12:
            pOVar18 = p_t1->cblkdatabuffer;
            bVar13 = true;
            if (cblk->numchunks != 0) {
              uVar48 = 0;
              lVar26 = 8;
              uVar32 = 0;
              do {
                memcpy(pOVar18 + uVar32,*(void **)((long)cblk->chunks + lVar26 + -8),
                       (ulong)*(uint *)((long)&cblk->chunks->data + lVar26));
                uVar32 = uVar32 + *(int *)((long)&cblk->chunks->data + lVar26);
                uVar48 = uVar48 + 1;
                lVar26 = lVar26 + 0x10;
              } while (uVar48 < cblk->numchunks);
              bVar13 = true;
            }
          }
          if (!bVar13) goto LAB_0012dfe9;
        }
        if (cblk->decoded_data == (OPJ_INT32 *)0x0) {
          local_70 = (OPJ_INT32 *)0x0;
        }
        else {
          local_70 = p_t1->data;
          p_t1->data = cblk->decoded_data;
        }
        if (cblk->real_num_segs != 0) {
          uVar32 = 2;
          uVar48 = 0;
          local_bc = 0;
          do {
            bVar54 = (uVar28 & 1) == 0;
            poVar9 = cblk->segs;
            bVar13 = (int)(cblk->numbps - 4) < (int)local_f4;
            bVar52 = 1 < uVar32;
            OVar33 = poVar9[uVar48].len;
            if ((bVar52 || bVar54) || bVar13) {
              opj_mqc_init_dec(&p_t1->mqc,pOVar18 + local_bc,OVar33,2);
            }
            else {
              opj_mqc_raw_init_dec(&p_t1->mqc,pOVar18 + local_bc,OVar33,2);
            }
            poVar9 = poVar9 + uVar48;
            local_bc = local_bc + poVar9->len;
            if ((0 < (int)local_f4) && (poVar9->real_num_passes != 0)) {
              uVar30 = 0;
              do {
                if (uVar32 == 2) {
                  opj_t1_dec_clnpass(p_t1,local_f4,uVar28);
                }
                else {
                  bVar22 = (byte)local_f4;
                  if (uVar32 == 1) {
                    if ((bVar52 || bVar54) || bVar13) {
                      uVar36 = p_t1->w;
                      uVar47 = (ulong)uVar36;
                      if ((uVar47 == 0x40) && (p_t1->h == 0x40)) {
                        puVar20 = (uint *)p_t1->data;
                        puVar21 = p_t1->flags + 0x43;
                        ppoVar38 = (p_t1->mqc).curctx;
                        uVar47 = (ulong)(p_t1->mqc).c;
                        uVar36 = (p_t1->mqc).a;
                        OVar33 = (p_t1->mqc).ct;
                        uVar29 = (uint)(1 << (bVar22 & 0x1f)) >> 1;
                        uVar24 = -uVar29;
                        uVar41 = 0;
                        do {
                          iVar39 = 0;
                          do {
                            puVar51 = puVar21;
                            puVar46 = puVar20;
                            uVar44 = *puVar51;
                            if (uVar44 != 0) {
                              if ((uVar44 & 0x200010) == 0x10) {
                                uVar42 = 0xf - ((uVar44 & 0x1ef) == 0);
                                if ((uVar44 >> 0x14 & 1) != 0) {
                                  uVar42 = 0x10;
                                }
                                ppoVar38 = (p_t1->mqc).ctxs + uVar42;
                                poVar10 = *ppoVar38;
                                uVar42 = poVar10->qeval;
                                uVar36 = uVar36 - uVar42;
                                if ((uint)(uVar47 >> 0x10) < uVar42) {
                                  uVar50 = (uint)(poVar10->mps == 0);
                                  if (uVar42 > uVar36) {
                                    uVar50 = poVar10->mps;
                                  }
                                  *ppoVar38 = (&poVar10->nmps)[uVar42 <= uVar36];
                                  uVar36 = uVar42;
                                  do {
                                    iVar16 = (int)uVar47;
                                    if (OVar33 == 0) {
                                      pOVar11 = (p_t1->mqc).bp;
                                      bVar22 = pOVar11[1];
                                      if (*pOVar11 == 0xff) {
                                        if (bVar22 < 0x90) {
                                          (p_t1->mqc).bp = pOVar11 + 1;
                                          iVar16 = iVar16 + (uint)bVar22 * 0x200;
                                          OVar33 = 7;
                                          goto LAB_0012e259;
                                        }
                                        iVar16 = iVar16 + 0xff00;
                                        pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (p_t1->mqc).bp = pOVar11 + 1;
                                        iVar16 = iVar16 + (uint)bVar22 * 0x100;
                                      }
                                      OVar33 = 8;
                                    }
LAB_0012e259:
                                    uVar36 = uVar36 * 2;
                                    uVar47 = (ulong)(uint)(iVar16 * 2);
                                    OVar33 = OVar33 - 1;
                                  } while (uVar36 < 0x8000);
                                }
                                else {
                                  uVar47 = (ulong)((int)uVar47 + uVar42 * -0x10000);
                                  if ((short)uVar36 < 0) {
                                    uVar50 = poVar10->mps;
                                  }
                                  else {
                                    uVar50 = (uint)(poVar10->mps == 0);
                                    if (uVar36 >= uVar42) {
                                      uVar50 = poVar10->mps;
                                    }
                                    *ppoVar38 = (&poVar10->nmps)[uVar36 < uVar42];
                                    do {
                                      iVar16 = (int)uVar47;
                                      if (OVar33 == 0) {
                                        pOVar11 = (p_t1->mqc).bp;
                                        bVar22 = pOVar11[1];
                                        if (*pOVar11 == 0xff) {
                                          if (bVar22 < 0x90) {
                                            (p_t1->mqc).bp = pOVar11 + 1;
                                            iVar16 = iVar16 + (uint)bVar22 * 0x200;
                                            OVar33 = 7;
                                            goto LAB_0012e2e0;
                                          }
                                          iVar16 = iVar16 + 0xff00;
                                          pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar11 + 1;
                                          iVar16 = iVar16 + (uint)bVar22 * 0x100;
                                        }
                                        OVar33 = 8;
                                      }
LAB_0012e2e0:
                                      uVar36 = uVar36 * 2;
                                      uVar47 = (ulong)(uint)(iVar16 * 2);
                                      OVar33 = OVar33 - 1;
                                    } while (uVar36 < 0x8000);
                                  }
                                }
                                uVar42 = uVar29;
                                if (uVar50 == *puVar46 >> 0x1f) {
                                  uVar42 = uVar24;
                                }
                                *puVar46 = uVar42 + *puVar46;
                                uVar44 = uVar44 | 0x100000;
                              }
                              if ((uVar44 & 0x1000080) == 0x80) {
                                uVar31 = (ulong)(0xf - ((uVar44 & 0xf78) == 0));
                                if ((uVar44 >> 0x17 & 1) != 0) {
                                  uVar31 = 0x10;
                                }
                                ppoVar38 = (p_t1->mqc).ctxs + uVar31;
                                poVar10 = *ppoVar38;
                                uVar42 = poVar10->qeval;
                                uVar36 = uVar36 - uVar42;
                                if ((uint)(uVar47 >> 0x10) < uVar42) {
                                  uVar50 = (uint)(poVar10->mps == 0);
                                  if (uVar42 > uVar36) {
                                    uVar50 = poVar10->mps;
                                  }
                                  *ppoVar38 = (&poVar10->nmps)[uVar42 <= uVar36];
                                  uVar36 = uVar42;
                                  do {
                                    iVar16 = (int)uVar47;
                                    if (OVar33 == 0) {
                                      pOVar11 = (p_t1->mqc).bp;
                                      bVar22 = pOVar11[1];
                                      if (*pOVar11 == 0xff) {
                                        if (bVar22 < 0x90) {
                                          (p_t1->mqc).bp = pOVar11 + 1;
                                          iVar16 = iVar16 + (uint)bVar22 * 0x200;
                                          OVar33 = 7;
                                          goto LAB_0012e3cf;
                                        }
                                        iVar16 = iVar16 + 0xff00;
                                        pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (p_t1->mqc).bp = pOVar11 + 1;
                                        iVar16 = iVar16 + (uint)bVar22 * 0x100;
                                      }
                                      OVar33 = 8;
                                    }
LAB_0012e3cf:
                                    uVar36 = uVar36 * 2;
                                    uVar47 = (ulong)(uint)(iVar16 * 2);
                                    OVar33 = OVar33 - 1;
                                  } while (uVar36 < 0x8000);
                                }
                                else {
                                  uVar47 = (ulong)((int)uVar47 + uVar42 * -0x10000);
                                  if ((short)uVar36 < 0) {
                                    uVar50 = poVar10->mps;
                                  }
                                  else {
                                    uVar50 = (uint)(poVar10->mps == 0);
                                    if (uVar36 >= uVar42) {
                                      uVar50 = poVar10->mps;
                                    }
                                    *ppoVar38 = (&poVar10->nmps)[uVar36 < uVar42];
                                    do {
                                      iVar16 = (int)uVar47;
                                      if (OVar33 == 0) {
                                        pOVar11 = (p_t1->mqc).bp;
                                        bVar22 = pOVar11[1];
                                        if (*pOVar11 == 0xff) {
                                          if (bVar22 < 0x90) {
                                            (p_t1->mqc).bp = pOVar11 + 1;
                                            iVar16 = iVar16 + (uint)bVar22 * 0x200;
                                            OVar33 = 7;
                                            goto LAB_0012e456;
                                          }
                                          iVar16 = iVar16 + 0xff00;
                                          pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar11 + 1;
                                          iVar16 = iVar16 + (uint)bVar22 * 0x100;
                                        }
                                        OVar33 = 8;
                                      }
LAB_0012e456:
                                      uVar36 = uVar36 * 2;
                                      uVar47 = (ulong)(uint)(iVar16 * 2);
                                      OVar33 = OVar33 - 1;
                                    } while (uVar36 < 0x8000);
                                  }
                                }
                                uVar42 = uVar29;
                                if (uVar50 == puVar46[0x40] >> 0x1f) {
                                  uVar42 = uVar24;
                                }
                                puVar46[0x40] = uVar42 + puVar46[0x40];
                                uVar44 = uVar44 | 0x800000;
                              }
                              if ((uVar44 & 0x8000400) == 0x400) {
                                uVar31 = (ulong)(0xf - ((uVar44 & 0x7bc0) == 0));
                                if ((uVar44 >> 0x1a & 1) != 0) {
                                  uVar31 = 0x10;
                                }
                                ppoVar38 = (p_t1->mqc).ctxs + uVar31;
                                poVar10 = *ppoVar38;
                                uVar42 = poVar10->qeval;
                                uVar36 = uVar36 - uVar42;
                                if ((uint)(uVar47 >> 0x10) < uVar42) {
                                  uVar50 = (uint)(poVar10->mps == 0);
                                  if (uVar42 > uVar36) {
                                    uVar50 = poVar10->mps;
                                  }
                                  *ppoVar38 = (&poVar10->nmps)[uVar42 <= uVar36];
                                  uVar36 = uVar42;
                                  do {
                                    iVar16 = (int)uVar47;
                                    if (OVar33 == 0) {
                                      pOVar11 = (p_t1->mqc).bp;
                                      bVar22 = pOVar11[1];
                                      if (*pOVar11 == 0xff) {
                                        if (bVar22 < 0x90) {
                                          (p_t1->mqc).bp = pOVar11 + 1;
                                          iVar16 = iVar16 + (uint)bVar22 * 0x200;
                                          OVar33 = 7;
                                          goto LAB_0012e54d;
                                        }
                                        iVar16 = iVar16 + 0xff00;
                                        pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (p_t1->mqc).bp = pOVar11 + 1;
                                        iVar16 = iVar16 + (uint)bVar22 * 0x100;
                                      }
                                      OVar33 = 8;
                                    }
LAB_0012e54d:
                                    uVar36 = uVar36 * 2;
                                    uVar47 = (ulong)(uint)(iVar16 * 2);
                                    OVar33 = OVar33 - 1;
                                  } while (uVar36 < 0x8000);
                                }
                                else {
                                  uVar47 = (ulong)((int)uVar47 + uVar42 * -0x10000);
                                  if ((short)uVar36 < 0) {
                                    uVar50 = poVar10->mps;
                                  }
                                  else {
                                    uVar50 = (uint)(poVar10->mps == 0);
                                    if (uVar36 >= uVar42) {
                                      uVar50 = poVar10->mps;
                                    }
                                    *ppoVar38 = (&poVar10->nmps)[uVar36 < uVar42];
                                    do {
                                      iVar16 = (int)uVar47;
                                      if (OVar33 == 0) {
                                        pOVar11 = (p_t1->mqc).bp;
                                        bVar22 = pOVar11[1];
                                        if (*pOVar11 == 0xff) {
                                          if (bVar22 < 0x90) {
                                            (p_t1->mqc).bp = pOVar11 + 1;
                                            iVar16 = iVar16 + (uint)bVar22 * 0x200;
                                            OVar33 = 7;
                                            goto LAB_0012e5d4;
                                          }
                                          iVar16 = iVar16 + 0xff00;
                                          pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar11 + 1;
                                          iVar16 = iVar16 + (uint)bVar22 * 0x100;
                                        }
                                        OVar33 = 8;
                                      }
LAB_0012e5d4:
                                      uVar36 = uVar36 * 2;
                                      uVar47 = (ulong)(uint)(iVar16 * 2);
                                      OVar33 = OVar33 - 1;
                                    } while (uVar36 < 0x8000);
                                  }
                                }
                                uVar42 = uVar29;
                                if (uVar50 == puVar46[0x80] >> 0x1f) {
                                  uVar42 = uVar24;
                                }
                                puVar46[0x80] = uVar42 + puVar46[0x80];
                                uVar44 = uVar44 | 0x4000000;
                              }
                              if ((uVar44 & 0x40002000) == 0x2000) {
                                uVar31 = (ulong)(0xf - ((uVar44 & 0x3de00) == 0));
                                if ((uVar44 >> 0x1d & 1) != 0) {
                                  uVar31 = 0x10;
                                }
                                ppoVar38 = (p_t1->mqc).ctxs + uVar31;
                                poVar10 = *ppoVar38;
                                uVar42 = poVar10->qeval;
                                uVar36 = uVar36 - uVar42;
                                if ((uint)(uVar47 >> 0x10) < uVar42) {
                                  uVar50 = (uint)(poVar10->mps == 0);
                                  if (uVar42 > uVar36) {
                                    uVar50 = poVar10->mps;
                                  }
                                  *ppoVar38 = (&poVar10->nmps)[uVar42 <= uVar36];
                                  uVar36 = uVar42;
                                  do {
                                    iVar16 = (int)uVar47;
                                    if (OVar33 == 0) {
                                      pOVar11 = (p_t1->mqc).bp;
                                      bVar22 = pOVar11[1];
                                      if (*pOVar11 == 0xff) {
                                        if (bVar22 < 0x90) {
                                          (p_t1->mqc).bp = pOVar11 + 1;
                                          iVar16 = iVar16 + (uint)bVar22 * 0x200;
                                          OVar33 = 7;
                                          goto LAB_0012e6cb;
                                        }
                                        iVar16 = iVar16 + 0xff00;
                                        pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                        *pOVar1 = *pOVar1 + 1;
                                      }
                                      else {
                                        (p_t1->mqc).bp = pOVar11 + 1;
                                        iVar16 = iVar16 + (uint)bVar22 * 0x100;
                                      }
                                      OVar33 = 8;
                                    }
LAB_0012e6cb:
                                    uVar36 = uVar36 * 2;
                                    uVar47 = (ulong)(uint)(iVar16 * 2);
                                    OVar33 = OVar33 - 1;
                                  } while (uVar36 < 0x8000);
                                }
                                else {
                                  uVar47 = (ulong)((int)uVar47 + uVar42 * -0x10000);
                                  if ((short)uVar36 < 0) {
                                    uVar50 = poVar10->mps;
                                  }
                                  else {
                                    uVar50 = (uint)(poVar10->mps == 0);
                                    if (uVar36 >= uVar42) {
                                      uVar50 = poVar10->mps;
                                    }
                                    *ppoVar38 = (&poVar10->nmps)[uVar36 < uVar42];
                                    do {
                                      iVar16 = (int)uVar47;
                                      if (OVar33 == 0) {
                                        pOVar11 = (p_t1->mqc).bp;
                                        bVar22 = pOVar11[1];
                                        if (*pOVar11 == 0xff) {
                                          if (bVar22 < 0x90) {
                                            (p_t1->mqc).bp = pOVar11 + 1;
                                            iVar16 = iVar16 + (uint)bVar22 * 0x200;
                                            OVar33 = 7;
                                            goto LAB_0012e752;
                                          }
                                          iVar16 = iVar16 + 0xff00;
                                          pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar11 + 1;
                                          iVar16 = iVar16 + (uint)bVar22 * 0x100;
                                        }
                                        OVar33 = 8;
                                      }
LAB_0012e752:
                                      uVar36 = uVar36 * 2;
                                      uVar47 = (ulong)(uint)(iVar16 * 2);
                                      OVar33 = OVar33 - 1;
                                    } while (uVar36 < 0x8000);
                                  }
                                }
                                uVar42 = uVar29;
                                if (uVar50 == puVar46[0xc0] >> 0x1f) {
                                  uVar42 = uVar24;
                                }
                                puVar46[0xc0] = uVar42 + puVar46[0xc0];
                                uVar44 = uVar44 | 0x20000000;
                              }
                              *puVar51 = uVar44;
                            }
                            iVar39 = iVar39 + 1;
                            puVar20 = puVar46 + 1;
                            puVar21 = puVar51 + 1;
                          } while (iVar39 != 0x40);
                          puVar20 = puVar46 + 0xc1;
                          puVar21 = puVar51 + 3;
                          bVar53 = uVar41 < 0x3c;
                          uVar41 = uVar41 + 4;
                        } while (bVar53);
                        (p_t1->mqc).curctx = ppoVar38;
                        (p_t1->mqc).c = (OPJ_UINT32)uVar47;
                        (p_t1->mqc).a = uVar36;
                        (p_t1->mqc).ct = OVar33;
                      }
                      else {
                        puVar20 = (uint *)p_t1->data;
                        puVar21 = p_t1->flags + (uVar36 + 3);
                        ppoVar38 = (p_t1->mqc).curctx;
                        uVar41 = (p_t1->mqc).c;
                        uVar31 = (ulong)uVar41;
                        uVar24 = (p_t1->mqc).a;
                        OVar33 = (p_t1->mqc).ct;
                        uVar42 = (uint)(1 << (bVar22 & 0x1f)) >> 1;
                        uVar29 = p_t1->h;
                        uVar44 = 0;
                        if (3 < uVar29) {
                          uVar25 = -uVar42;
                          uVar50 = uVar36 * 3;
                          uVar44 = 0;
                          do {
                            if (uVar47 != 0) {
                              uVar41 = 0;
                              do {
                                uVar29 = *puVar21;
                                if (uVar29 != 0) {
                                  if ((uVar29 & 0x200010) == 0x10) {
                                    uVar43 = 0xf - ((uVar29 & 0x1ef) == 0);
                                    if ((uVar29 >> 0x14 & 1) != 0) {
                                      uVar43 = 0x10;
                                    }
                                    ppoVar38 = (p_t1->mqc).ctxs + uVar43;
                                    poVar10 = *ppoVar38;
                                    uVar43 = poVar10->qeval;
                                    uVar24 = uVar24 - uVar43;
                                    if ((uint)(uVar31 >> 0x10) < uVar43) {
                                      uVar49 = (uint)(poVar10->mps == 0);
                                      if (uVar43 > uVar24) {
                                        uVar49 = poVar10->mps;
                                      }
                                      *ppoVar38 = (&poVar10->nmps)[uVar43 <= uVar24];
                                      do {
                                        iVar39 = (int)uVar31;
                                        if (OVar33 == 0) {
                                          pOVar11 = (p_t1->mqc).bp;
                                          bVar22 = pOVar11[1];
                                          if (*pOVar11 == 0xff) {
                                            if (bVar22 < 0x90) {
                                              (p_t1->mqc).bp = pOVar11 + 1;
                                              iVar39 = iVar39 + (uint)bVar22 * 0x200;
                                              OVar33 = 7;
                                              goto LAB_0012ef3f;
                                            }
                                            iVar39 = iVar39 + 0xff00;
                                            pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (p_t1->mqc).bp = pOVar11 + 1;
                                            iVar39 = iVar39 + (uint)bVar22 * 0x100;
                                          }
                                          OVar33 = 8;
                                        }
LAB_0012ef3f:
                                        uVar43 = uVar43 * 2;
                                        uVar31 = (ulong)(uint)(iVar39 * 2);
                                        OVar33 = OVar33 - 1;
                                        uVar24 = uVar43;
                                      } while (uVar43 < 0x8000);
                                    }
                                    else {
                                      uVar31 = (ulong)((int)uVar31 + uVar43 * -0x10000);
                                      if ((short)uVar24 < 0) {
                                        uVar49 = poVar10->mps;
                                      }
                                      else {
                                        uVar49 = (uint)(poVar10->mps == 0);
                                        if (uVar24 >= uVar43) {
                                          uVar49 = poVar10->mps;
                                        }
                                        *ppoVar38 = (&poVar10->nmps)[uVar24 < uVar43];
                                        do {
                                          iVar39 = (int)uVar31;
                                          if (OVar33 == 0) {
                                            pOVar11 = (p_t1->mqc).bp;
                                            bVar22 = pOVar11[1];
                                            if (*pOVar11 == 0xff) {
                                              if (bVar22 < 0x90) {
                                                (p_t1->mqc).bp = pOVar11 + 1;
                                                iVar39 = iVar39 + (uint)bVar22 * 0x200;
                                                OVar33 = 7;
                                                goto LAB_0012efd8;
                                              }
                                              iVar39 = iVar39 + 0xff00;
                                              pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                              *pOVar1 = *pOVar1 + 1;
                                            }
                                            else {
                                              (p_t1->mqc).bp = pOVar11 + 1;
                                              iVar39 = iVar39 + (uint)bVar22 * 0x100;
                                            }
                                            OVar33 = 8;
                                          }
LAB_0012efd8:
                                          uVar24 = uVar24 * 2;
                                          uVar31 = (ulong)(uint)(iVar39 * 2);
                                          OVar33 = OVar33 - 1;
                                        } while (uVar24 < 0x8000);
                                      }
                                    }
                                    uVar43 = uVar42;
                                    if (uVar49 == *puVar20 >> 0x1f) {
                                      uVar43 = uVar25;
                                    }
                                    *puVar20 = uVar43 + *puVar20;
                                    uVar29 = uVar29 | 0x100000;
                                  }
                                  if ((uVar29 & 0x1000080) == 0x80) {
                                    uVar45 = (ulong)(0xf - ((uVar29 & 0xf78) == 0));
                                    if ((uVar29 >> 0x17 & 1) != 0) {
                                      uVar45 = 0x10;
                                    }
                                    ppoVar38 = (p_t1->mqc).ctxs + uVar45;
                                    poVar10 = *ppoVar38;
                                    uVar43 = poVar10->qeval;
                                    uVar24 = uVar24 - uVar43;
                                    if ((uint)(uVar31 >> 0x10) < uVar43) {
                                      uVar49 = (uint)(poVar10->mps == 0);
                                      if (uVar43 > uVar24) {
                                        uVar49 = poVar10->mps;
                                      }
                                      *ppoVar38 = (&poVar10->nmps)[uVar43 <= uVar24];
                                      do {
                                        iVar39 = (int)uVar31;
                                        if (OVar33 == 0) {
                                          pOVar11 = (p_t1->mqc).bp;
                                          bVar22 = pOVar11[1];
                                          if (*pOVar11 == 0xff) {
                                            if (bVar22 < 0x90) {
                                              (p_t1->mqc).bp = pOVar11 + 1;
                                              iVar39 = iVar39 + (uint)bVar22 * 0x200;
                                              OVar33 = 7;
                                              goto LAB_0012f0e1;
                                            }
                                            iVar39 = iVar39 + 0xff00;
                                            pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (p_t1->mqc).bp = pOVar11 + 1;
                                            iVar39 = iVar39 + (uint)bVar22 * 0x100;
                                          }
                                          OVar33 = 8;
                                        }
LAB_0012f0e1:
                                        uVar43 = uVar43 * 2;
                                        uVar31 = (ulong)(uint)(iVar39 * 2);
                                        OVar33 = OVar33 - 1;
                                        uVar24 = uVar43;
                                      } while (uVar43 < 0x8000);
                                    }
                                    else {
                                      uVar31 = (ulong)((int)uVar31 + uVar43 * -0x10000);
                                      if ((short)uVar24 < 0) {
                                        uVar49 = poVar10->mps;
                                      }
                                      else {
                                        uVar49 = (uint)(poVar10->mps == 0);
                                        if (uVar24 >= uVar43) {
                                          uVar49 = poVar10->mps;
                                        }
                                        *ppoVar38 = (&poVar10->nmps)[uVar24 < uVar43];
                                        do {
                                          iVar39 = (int)uVar31;
                                          if (OVar33 == 0) {
                                            pOVar11 = (p_t1->mqc).bp;
                                            bVar22 = pOVar11[1];
                                            if (*pOVar11 == 0xff) {
                                              if (bVar22 < 0x90) {
                                                (p_t1->mqc).bp = pOVar11 + 1;
                                                iVar39 = iVar39 + (uint)bVar22 * 0x200;
                                                OVar33 = 7;
                                                goto LAB_0012f17f;
                                              }
                                              iVar39 = iVar39 + 0xff00;
                                              pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                              *pOVar1 = *pOVar1 + 1;
                                            }
                                            else {
                                              (p_t1->mqc).bp = pOVar11 + 1;
                                              iVar39 = iVar39 + (uint)bVar22 * 0x100;
                                            }
                                            OVar33 = 8;
                                          }
LAB_0012f17f:
                                          uVar24 = uVar24 * 2;
                                          uVar31 = (ulong)(uint)(iVar39 * 2);
                                          OVar33 = OVar33 - 1;
                                        } while (uVar24 < 0x8000);
                                      }
                                    }
                                    uVar43 = uVar42;
                                    if (uVar49 == puVar20[uVar47] >> 0x1f) {
                                      uVar43 = uVar25;
                                    }
                                    puVar20[uVar47] = uVar43 + puVar20[uVar47];
                                    uVar29 = uVar29 | 0x800000;
                                  }
                                  if ((uVar29 & 0x8000400) == 0x400) {
                                    uVar45 = (ulong)(0xf - ((uVar29 & 0x7bc0) == 0));
                                    if ((uVar29 >> 0x1a & 1) != 0) {
                                      uVar45 = 0x10;
                                    }
                                    ppoVar38 = (p_t1->mqc).ctxs + uVar45;
                                    poVar10 = *ppoVar38;
                                    uVar43 = poVar10->qeval;
                                    uVar24 = uVar24 - uVar43;
                                    if ((uint)(uVar31 >> 0x10) < uVar43) {
                                      uVar49 = (uint)(poVar10->mps == 0);
                                      if (uVar43 > uVar24) {
                                        uVar49 = poVar10->mps;
                                      }
                                      *ppoVar38 = (&poVar10->nmps)[uVar43 <= uVar24];
                                      do {
                                        iVar39 = (int)uVar31;
                                        if (OVar33 == 0) {
                                          pOVar11 = (p_t1->mqc).bp;
                                          bVar22 = pOVar11[1];
                                          if (*pOVar11 == 0xff) {
                                            if (bVar22 < 0x90) {
                                              (p_t1->mqc).bp = pOVar11 + 1;
                                              iVar39 = iVar39 + (uint)bVar22 * 0x200;
                                              OVar33 = 7;
                                              goto LAB_0012f28a;
                                            }
                                            iVar39 = iVar39 + 0xff00;
                                            pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (p_t1->mqc).bp = pOVar11 + 1;
                                            iVar39 = iVar39 + (uint)bVar22 * 0x100;
                                          }
                                          OVar33 = 8;
                                        }
LAB_0012f28a:
                                        uVar43 = uVar43 * 2;
                                        uVar31 = (ulong)(uint)(iVar39 * 2);
                                        OVar33 = OVar33 - 1;
                                        uVar24 = uVar43;
                                      } while (uVar43 < 0x8000);
                                    }
                                    else {
                                      uVar31 = (ulong)((int)uVar31 + uVar43 * -0x10000);
                                      if ((short)uVar24 < 0) {
                                        uVar49 = poVar10->mps;
                                      }
                                      else {
                                        uVar49 = (uint)(poVar10->mps == 0);
                                        if (uVar24 >= uVar43) {
                                          uVar49 = poVar10->mps;
                                        }
                                        *ppoVar38 = (&poVar10->nmps)[uVar24 < uVar43];
                                        do {
                                          iVar39 = (int)uVar31;
                                          if (OVar33 == 0) {
                                            pOVar11 = (p_t1->mqc).bp;
                                            bVar22 = pOVar11[1];
                                            if (*pOVar11 == 0xff) {
                                              if (bVar22 < 0x90) {
                                                (p_t1->mqc).bp = pOVar11 + 1;
                                                iVar39 = iVar39 + (uint)bVar22 * 0x200;
                                                OVar33 = 7;
                                                goto LAB_0012f328;
                                              }
                                              iVar39 = iVar39 + 0xff00;
                                              pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                              *pOVar1 = *pOVar1 + 1;
                                            }
                                            else {
                                              (p_t1->mqc).bp = pOVar11 + 1;
                                              iVar39 = iVar39 + (uint)bVar22 * 0x100;
                                            }
                                            OVar33 = 8;
                                          }
LAB_0012f328:
                                          uVar24 = uVar24 * 2;
                                          uVar31 = (ulong)(uint)(iVar39 * 2);
                                          OVar33 = OVar33 - 1;
                                        } while (uVar24 < 0x8000);
                                      }
                                    }
                                    uVar43 = uVar42;
                                    if (uVar49 == puVar20[uVar36 * 2] >> 0x1f) {
                                      uVar43 = uVar25;
                                    }
                                    puVar20[uVar36 * 2] = uVar43 + puVar20[uVar36 * 2];
                                    uVar29 = uVar29 | 0x4000000;
                                  }
                                  if ((uVar29 & 0x40002000) == 0x2000) {
                                    uVar45 = (ulong)(0xf - ((uVar29 & 0x3de00) == 0));
                                    if ((uVar29 >> 0x1d & 1) != 0) {
                                      uVar45 = 0x10;
                                    }
                                    ppoVar38 = (p_t1->mqc).ctxs + uVar45;
                                    poVar10 = *ppoVar38;
                                    uVar43 = poVar10->qeval;
                                    uVar24 = uVar24 - uVar43;
                                    if ((uint)(uVar31 >> 0x10) < uVar43) {
                                      uVar49 = (uint)(poVar10->mps == 0);
                                      if (uVar43 > uVar24) {
                                        uVar49 = poVar10->mps;
                                      }
                                      *ppoVar38 = (&poVar10->nmps)[uVar43 <= uVar24];
                                      do {
                                        iVar39 = (int)uVar31;
                                        if (OVar33 == 0) {
                                          pOVar11 = (p_t1->mqc).bp;
                                          bVar22 = pOVar11[1];
                                          if (*pOVar11 == 0xff) {
                                            if (bVar22 < 0x90) {
                                              (p_t1->mqc).bp = pOVar11 + 1;
                                              iVar39 = iVar39 + (uint)bVar22 * 0x200;
                                              OVar33 = 7;
                                              goto LAB_0012f442;
                                            }
                                            iVar39 = iVar39 + 0xff00;
                                            pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (p_t1->mqc).bp = pOVar11 + 1;
                                            iVar39 = iVar39 + (uint)bVar22 * 0x100;
                                          }
                                          OVar33 = 8;
                                        }
LAB_0012f442:
                                        uVar43 = uVar43 * 2;
                                        uVar31 = (ulong)(uint)(iVar39 * 2);
                                        OVar33 = OVar33 - 1;
                                        uVar24 = uVar43;
                                      } while (uVar43 < 0x8000);
                                    }
                                    else {
                                      uVar31 = (ulong)((int)uVar31 + uVar43 * -0x10000);
                                      if ((short)uVar24 < 0) {
                                        uVar49 = poVar10->mps;
                                      }
                                      else {
                                        uVar49 = (uint)(poVar10->mps == 0);
                                        if (uVar24 >= uVar43) {
                                          uVar49 = poVar10->mps;
                                        }
                                        *ppoVar38 = (&poVar10->nmps)[uVar24 < uVar43];
                                        do {
                                          iVar39 = (int)uVar31;
                                          if (OVar33 == 0) {
                                            pOVar11 = (p_t1->mqc).bp;
                                            bVar22 = pOVar11[1];
                                            if (*pOVar11 == 0xff) {
                                              if (bVar22 < 0x90) {
                                                (p_t1->mqc).bp = pOVar11 + 1;
                                                iVar39 = iVar39 + (uint)bVar22 * 0x200;
                                                OVar33 = 7;
                                                goto LAB_0012f4e0;
                                              }
                                              iVar39 = iVar39 + 0xff00;
                                              pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                              *pOVar1 = *pOVar1 + 1;
                                            }
                                            else {
                                              (p_t1->mqc).bp = pOVar11 + 1;
                                              iVar39 = iVar39 + (uint)bVar22 * 0x100;
                                            }
                                            OVar33 = 8;
                                          }
LAB_0012f4e0:
                                          uVar24 = uVar24 * 2;
                                          uVar31 = (ulong)(uint)(iVar39 * 2);
                                          OVar33 = OVar33 - 1;
                                        } while (uVar24 < 0x8000);
                                      }
                                    }
                                    uVar43 = uVar42;
                                    if (uVar49 == puVar20[uVar50] >> 0x1f) {
                                      uVar43 = uVar25;
                                    }
                                    puVar20[uVar50] = uVar43 + puVar20[uVar50];
                                    uVar29 = uVar29 | 0x20000000;
                                  }
                                  *puVar21 = uVar29;
                                }
                                uVar41 = uVar41 + 1;
                                puVar20 = puVar20 + 1;
                                puVar21 = puVar21 + 1;
                              } while (uVar41 != uVar36);
                            }
                            uVar41 = (uint)uVar31;
                            uVar44 = uVar44 + 4;
                            puVar20 = puVar20 + uVar50;
                            puVar21 = puVar21 + 2;
                            uVar29 = p_t1->h;
                          } while (uVar44 < (uVar29 & 0xfffffffc));
                        }
                        (p_t1->mqc).curctx = ppoVar38;
                        (p_t1->mqc).c = uVar41;
                        (p_t1->mqc).a = uVar24;
                        (p_t1->mqc).ct = OVar33;
                        if (uVar47 != 0 && uVar44 < uVar29) {
                          uVar41 = 0;
                          do {
                            if (p_t1->h != uVar44) {
                              uVar47 = 0;
                              do {
                                bVar22 = (char)uVar47 * '\x03';
                                if ((0x200010 << (bVar22 & 0x1f) & *puVar21) ==
                                    0x10 << (bVar22 & 0x1f)) {
                                  uVar24 = *puVar21 >> (bVar22 & 0x1f);
                                  iVar39 = 0xf - (uint)((uVar24 & 0x1ef) == 0);
                                  if ((uVar24 >> 0x14 & 1) != 0) {
                                    iVar39 = 0x10;
                                  }
                                  ppoVar38 = (opj_mqc_state_t **)
                                             ((long)(p_t1->mqc).ctxs + (ulong)(uint)(iVar39 << 3));
                                  (p_t1->mqc).curctx = ppoVar38;
                                  puVar46 = *(uint **)((long)(p_t1->mqc).ctxs +
                                                      (ulong)(uint)(iVar39 << 3));
                                  uVar24 = *puVar46;
                                  uVar29 = (p_t1->mqc).c;
                                  uVar50 = (p_t1->mqc).a - uVar24;
                                  (p_t1->mqc).a = uVar50;
                                  if (uVar29 >> 0x10 < uVar24) {
                                    (p_t1->mqc).a = uVar24;
                                    uVar25 = (uint)(puVar46[1] == 0);
                                    if (uVar24 > uVar50) {
                                      uVar25 = puVar46[1];
                                    }
                                    *ppoVar38 = *(opj_mqc_state_t **)
                                                 (puVar46 + (ulong)(uVar24 <= uVar50) * 2 + 2);
                                    uVar24 = (p_t1->mqc).a;
                                    OVar33 = (p_t1->mqc).ct;
                                    do {
                                      if (OVar33 == 0) {
                                        pOVar11 = (p_t1->mqc).bp;
                                        bVar2 = pOVar11[1];
                                        if (*pOVar11 == 0xff) {
                                          if (bVar2 < 0x90) {
                                            (p_t1->mqc).bp = pOVar11 + 1;
                                            uVar29 = uVar29 + (uint)bVar2 * 0x200;
                                            (p_t1->mqc).c = uVar29;
                                            (p_t1->mqc).ct = 7;
                                            OVar33 = 7;
                                            goto LAB_0012f6ce;
                                          }
                                          uVar29 = uVar29 + 0xff00;
                                          (p_t1->mqc).c = uVar29;
                                          (p_t1->mqc).ct = 8;
                                          pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar1 = *pOVar1 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar11 + 1;
                                          uVar29 = uVar29 + (uint)bVar2 * 0x100;
                                          (p_t1->mqc).c = uVar29;
                                          (p_t1->mqc).ct = 8;
                                        }
                                        OVar33 = 8;
                                      }
LAB_0012f6ce:
                                      uVar24 = uVar24 * 2;
                                      (p_t1->mqc).a = uVar24;
                                      uVar29 = uVar29 * 2;
                                      (p_t1->mqc).c = uVar29;
                                      OVar33 = OVar33 - 1;
                                      (p_t1->mqc).ct = OVar33;
                                    } while (uVar24 < 0x8000);
                                  }
                                  else {
                                    OVar33 = uVar29 + uVar24 * -0x10000;
                                    (p_t1->mqc).c = OVar33;
                                    if ((short)uVar50 < 0) {
                                      uVar25 = puVar46[1];
                                    }
                                    else {
                                      uVar25 = (uint)(puVar46[1] == 0);
                                      if (uVar50 >= uVar24) {
                                        uVar25 = puVar46[1];
                                      }
                                      *ppoVar38 = *(opj_mqc_state_t **)
                                                   (puVar46 + (ulong)(uVar50 < uVar24) * 2 + 2);
                                      OVar40 = (p_t1->mqc).ct;
                                      do {
                                        if (OVar40 == 0) {
                                          pOVar11 = (p_t1->mqc).bp;
                                          bVar2 = pOVar11[1];
                                          if (*pOVar11 == 0xff) {
                                            if (bVar2 < 0x90) {
                                              (p_t1->mqc).bp = pOVar11 + 1;
                                              OVar33 = OVar33 + (uint)bVar2 * 0x200;
                                              (p_t1->mqc).c = OVar33;
                                              (p_t1->mqc).ct = 7;
                                              OVar40 = 7;
                                              goto LAB_0012f7a2;
                                            }
                                            OVar33 = OVar33 + 0xff00;
                                            (p_t1->mqc).c = OVar33;
                                            (p_t1->mqc).ct = 8;
                                            pOVar1 = &(p_t1->mqc).end_of_byte_stream_counter;
                                            *pOVar1 = *pOVar1 + 1;
                                          }
                                          else {
                                            (p_t1->mqc).bp = pOVar11 + 1;
                                            OVar33 = OVar33 + (uint)bVar2 * 0x100;
                                            (p_t1->mqc).c = OVar33;
                                            (p_t1->mqc).ct = 8;
                                          }
                                          OVar40 = 8;
                                        }
LAB_0012f7a2:
                                        uVar50 = uVar50 * 2;
                                        (p_t1->mqc).a = uVar50;
                                        OVar33 = OVar33 * 2;
                                        (p_t1->mqc).c = OVar33;
                                        OVar40 = OVar40 - 1;
                                        (p_t1->mqc).ct = OVar40;
                                      } while (uVar50 < 0x8000);
                                    }
                                  }
                                  uVar29 = uVar36 * (int)uVar47;
                                  uVar24 = uVar42;
                                  if (uVar25 == puVar20[uVar29] >> 0x1f) {
                                    uVar24 = -uVar42;
                                  }
                                  puVar20[uVar29] = uVar24 + puVar20[uVar29];
                                  *puVar21 = *puVar21 | 0x100000 << (bVar22 & 0x1f);
                                }
                                uVar47 = uVar47 + 1;
                              } while (uVar47 < p_t1->h - uVar44);
                            }
                            uVar41 = uVar41 + 1;
                            puVar20 = puVar20 + 1;
                            puVar21 = puVar21 + 1;
                          } while (uVar41 != uVar36);
                        }
                      }
                    }
                    else {
                      puVar20 = (uint *)p_t1->data;
                      uVar36 = p_t1->w;
                      uVar47 = (ulong)uVar36;
                      puVar21 = p_t1->flags + (uVar36 + 3);
                      uVar24 = (uint)(1 << (bVar22 & 0x1f)) >> 1;
                      uVar41 = p_t1->h;
                      uVar29 = 0;
                      if (3 < uVar41) {
                        uVar50 = -uVar24;
                        uVar44 = uVar36 * 3;
                        uVar29 = 0;
                        uVar31 = uVar47;
                        uVar42 = uVar36;
                        do {
                          while (uVar42 != 0) {
                            if (*puVar21 != 0) {
                              if ((*puVar21 & 0x200010) == 0x10) {
                                if ((p_t1->mqc).ct == 0) {
                                  pbVar12 = (p_t1->mqc).bp;
                                  bVar22 = *pbVar12;
                                  if ((p_t1->mqc).c == 0xff) {
                                    if (0x8f < bVar22) {
                                      (p_t1->mqc).c = 0xff;
                                      goto LAB_0012e8bc;
                                    }
                                    (p_t1->mqc).c = (uint)bVar22;
                                    (p_t1->mqc).bp = pbVar12 + 1;
                                    OVar33 = 7;
                                  }
                                  else {
                                    (p_t1->mqc).c = (uint)bVar22;
                                    (p_t1->mqc).bp = pbVar12 + 1;
LAB_0012e8bc:
                                    OVar33 = 8;
                                  }
                                  (p_t1->mqc).ct = OVar33;
                                }
                                uVar42 = (p_t1->mqc).ct - 1;
                                (p_t1->mqc).ct = uVar42;
                                uVar41 = uVar24;
                                if ((uint)(((p_t1->mqc).c >> (uVar42 & 0x1f) & 1) != 0) ==
                                    *puVar20 >> 0x1f) {
                                  uVar41 = uVar50;
                                }
                                *puVar20 = uVar41 + *puVar20;
                                *(byte *)((long)puVar21 + 2) = *(byte *)((long)puVar21 + 2) | 0x10;
                              }
                              if ((*puVar21 & 0x1000080) == 0x80) {
                                if ((p_t1->mqc).ct == 0) {
                                  pbVar12 = (p_t1->mqc).bp;
                                  bVar22 = *pbVar12;
                                  if ((p_t1->mqc).c == 0xff) {
                                    if (0x8f < bVar22) {
                                      (p_t1->mqc).c = 0xff;
                                      goto LAB_0012e944;
                                    }
                                    (p_t1->mqc).c = (uint)bVar22;
                                    (p_t1->mqc).bp = pbVar12 + 1;
                                    OVar33 = 7;
                                  }
                                  else {
                                    (p_t1->mqc).c = (uint)bVar22;
                                    (p_t1->mqc).bp = pbVar12 + 1;
LAB_0012e944:
                                    OVar33 = 8;
                                  }
                                  (p_t1->mqc).ct = OVar33;
                                }
                                uVar42 = (p_t1->mqc).ct - 1;
                                (p_t1->mqc).ct = uVar42;
                                uVar41 = uVar24;
                                if ((uint)(((p_t1->mqc).c >> (uVar42 & 0x1f) & 1) != 0) ==
                                    puVar20[uVar47] >> 0x1f) {
                                  uVar41 = uVar50;
                                }
                                puVar20[uVar47] = uVar41 + puVar20[uVar47];
                                *(byte *)((long)puVar21 + 2) = *(byte *)((long)puVar21 + 2) | 0x80;
                              }
                              if ((*puVar21 & 0x8000400) == 0x400) {
                                if ((p_t1->mqc).ct == 0) {
                                  pbVar12 = (p_t1->mqc).bp;
                                  bVar22 = *pbVar12;
                                  if ((p_t1->mqc).c == 0xff) {
                                    if (0x8f < bVar22) {
                                      (p_t1->mqc).c = 0xff;
                                      goto LAB_0012e9d2;
                                    }
                                    (p_t1->mqc).c = (uint)bVar22;
                                    (p_t1->mqc).bp = pbVar12 + 1;
                                    OVar33 = 7;
                                  }
                                  else {
                                    (p_t1->mqc).c = (uint)bVar22;
                                    (p_t1->mqc).bp = pbVar12 + 1;
LAB_0012e9d2:
                                    OVar33 = 8;
                                  }
                                  (p_t1->mqc).ct = OVar33;
                                }
                                uVar42 = (p_t1->mqc).ct - 1;
                                (p_t1->mqc).ct = uVar42;
                                uVar41 = uVar24;
                                if ((uint)(((p_t1->mqc).c >> (uVar42 & 0x1f) & 1) != 0) ==
                                    puVar20[uVar36 * 2] >> 0x1f) {
                                  uVar41 = uVar50;
                                }
                                puVar20[uVar36 * 2] = uVar41 + puVar20[uVar36 * 2];
                                *(byte *)((long)puVar21 + 3) = *(byte *)((long)puVar21 + 3) | 4;
                              }
                              if ((*puVar21 & 0x40002000) == 0x2000) {
                                if ((p_t1->mqc).ct == 0) {
                                  pbVar12 = (p_t1->mqc).bp;
                                  bVar22 = *pbVar12;
                                  if ((p_t1->mqc).c == 0xff) {
                                    if (0x8f < bVar22) {
                                      (p_t1->mqc).c = 0xff;
                                      goto LAB_0012ea62;
                                    }
                                    (p_t1->mqc).c = (uint)bVar22;
                                    (p_t1->mqc).bp = pbVar12 + 1;
                                    OVar33 = 7;
                                  }
                                  else {
                                    (p_t1->mqc).c = (uint)bVar22;
                                    (p_t1->mqc).bp = pbVar12 + 1;
LAB_0012ea62:
                                    OVar33 = 8;
                                  }
                                  (p_t1->mqc).ct = OVar33;
                                }
                                uVar42 = (p_t1->mqc).ct - 1;
                                (p_t1->mqc).ct = uVar42;
                                uVar41 = uVar24;
                                if ((uint)(((p_t1->mqc).c >> (uVar42 & 0x1f) & 1) != 0) ==
                                    puVar20[uVar44] >> 0x1f) {
                                  uVar41 = uVar50;
                                }
                                puVar20[uVar44] = uVar41 + puVar20[uVar44];
                                *(byte *)((long)puVar21 + 3) = *(byte *)((long)puVar21 + 3) | 0x20;
                              }
                            }
                            puVar21 = puVar21 + 1;
                            puVar20 = puVar20 + 1;
                            uVar42 = (int)uVar31 - 1;
                            uVar31 = (ulong)uVar42;
                          }
                          uVar29 = uVar29 + 4;
                          puVar21 = puVar21 + 2;
                          puVar20 = puVar20 + uVar44;
                          uVar41 = p_t1->h;
                          uVar31 = uVar47;
                          uVar42 = uVar36;
                        } while (uVar29 < (uVar41 & 0xfffffffc));
                      }
                      if (uVar36 != 0 && uVar29 < uVar41) {
                        uVar41 = 0;
                        do {
                          if (p_t1->h != uVar29) {
                            uVar31 = 0;
                            bVar22 = 0;
                            uVar47 = 0;
                            do {
                              if ((0x200010 << (bVar22 & 0x1f) & *puVar21) ==
                                  0x10 << (bVar22 & 0x1f)) {
                                if ((p_t1->mqc).ct == 0) {
                                  pbVar12 = (p_t1->mqc).bp;
                                  bVar2 = *pbVar12;
                                  if ((p_t1->mqc).c == 0xff) {
                                    if (0x8f < bVar2) {
                                      (p_t1->mqc).c = 0xff;
                                      goto LAB_0012eb69;
                                    }
                                    (p_t1->mqc).c = (uint)bVar2;
                                    (p_t1->mqc).bp = pbVar12 + 1;
                                    OVar33 = 7;
                                  }
                                  else {
                                    (p_t1->mqc).c = (uint)bVar2;
                                    (p_t1->mqc).bp = pbVar12 + 1;
LAB_0012eb69:
                                    OVar33 = 8;
                                  }
                                  (p_t1->mqc).ct = OVar33;
                                }
                                uVar42 = (p_t1->mqc).ct - 1;
                                (p_t1->mqc).ct = uVar42;
                                uVar44 = uVar24;
                                if ((uint)(((p_t1->mqc).c >> (uVar42 & 0x1f) & 1) != 0) ==
                                    puVar20[uVar31] >> 0x1f) {
                                  uVar44 = -uVar24;
                                }
                                puVar20[uVar31] = uVar44 + puVar20[uVar31];
                                *puVar21 = *puVar21 | 0x100000 << (bVar22 & 0x1f);
                              }
                              uVar47 = uVar47 + 1;
                              bVar22 = bVar22 + 3;
                              uVar31 = (ulong)((int)uVar31 + uVar36);
                            } while (uVar47 < p_t1->h - uVar29);
                          }
                          uVar41 = uVar41 + 1;
                          puVar21 = puVar21 + 1;
                          puVar20 = puVar20 + 1;
                        } while (uVar41 != uVar36);
                      }
                    }
                  }
                  else if ((bVar52 || bVar54) || bVar13) {
                    opj_t1_dec_sigpass_mqc(p_t1,local_f4,uVar28);
                  }
                  else {
                    pOVar17 = p_t1->data;
                    uVar36 = p_t1->w;
                    uVar47 = (ulong)uVar36;
                    flagsp = p_t1->flags + (uVar36 + 3);
                    uVar29 = (uint)(1 << (bVar22 & 0x1f)) >> 1 | 1 << (local_f4 & 0x1f);
                    uVar41 = p_t1->h;
                    uVar24 = 0;
                    if (3 < uVar41) {
                      uVar24 = 0;
                      uVar31 = uVar47;
                      uVar44 = uVar36;
                      do {
                        while (uVar44 != 0) {
                          if (*flagsp != 0) {
                            opj_t1_dec_sigpass_step_raw(p_t1,flagsp,pOVar17,uVar29,uVar28 & 8,0);
                            opj_t1_dec_sigpass_step_raw(p_t1,flagsp,pOVar17 + uVar47,uVar29,0,1);
                            opj_t1_dec_sigpass_step_raw(p_t1,flagsp,pOVar17 + uVar36 * 2,uVar29,0,2)
                            ;
                            opj_t1_dec_sigpass_step_raw(p_t1,flagsp,pOVar17 + uVar36 * 3,uVar29,0,3)
                            ;
                          }
                          flagsp = flagsp + 1;
                          pOVar17 = pOVar17 + 1;
                          uVar44 = (int)uVar31 - 1;
                          uVar31 = (ulong)uVar44;
                        }
                        uVar24 = uVar24 + 4;
                        flagsp = flagsp + 2;
                        pOVar17 = pOVar17 + uVar36 * 3;
                        uVar41 = p_t1->h;
                        uVar31 = uVar47;
                        uVar44 = uVar36;
                      } while (uVar24 < (uVar41 & 0xfffffffc));
                    }
                    if (uVar36 != 0 && uVar24 < uVar41) {
                      uVar41 = 0;
                      do {
                        if (p_t1->h != uVar24) {
                          uVar31 = 0;
                          uVar47 = 0;
                          do {
                            opj_t1_dec_sigpass_step_raw
                                      (p_t1,flagsp,pOVar17 + uVar31,uVar29,uVar28 & 8,
                                       (OPJ_UINT32)uVar47);
                            uVar47 = uVar47 + 1;
                            uVar31 = (ulong)((int)uVar31 + uVar36);
                          } while (uVar47 < p_t1->h - uVar24);
                        }
                        uVar41 = uVar41 + 1;
                        flagsp = flagsp + 1;
                        pOVar17 = pOVar17 + 1;
                      } while (uVar41 != uVar36);
                    }
                  }
                }
                if (((byte)uVar28 >> 1 & ((bVar52 || bVar54) || bVar13)) != 0) {
                  opj_mqc_resetstates(&p_t1->mqc);
                  opj_mqc_setstate(&p_t1->mqc,0x12,0,0x2e);
                  opj_mqc_setstate(&p_t1->mqc,0x11,0,3);
                  opj_mqc_setstate(&p_t1->mqc,0,0,4);
                }
                uVar36 = uVar32 + 1;
                uVar32 = uVar36;
                if (uVar36 == 3) {
                  uVar32 = 0;
                }
                local_f4 = local_f4 - (uVar36 == 3);
                uVar30 = uVar30 + 1;
              } while ((uVar30 < poVar9->real_num_passes) && (0 < (int)local_f4));
            }
            opq_mqc_finish_dec(&p_t1->mqc);
            uVar48 = uVar48 + 1;
          } while (uVar48 < cblk->real_num_segs);
        }
        if (OVar15 != 0) {
          if ((p_t1->mqc).bp + 2 < (p_t1->mqc).end) {
            if (p_manager_mutex != (opj_mutex_t *)0x0) {
              opj_mutex_lock(p_manager_mutex);
            }
            iVar39 = *(int *)&(p_t1->mqc).end;
            iVar16 = *(int *)&(p_t1->mqc).bp;
            iVar6 = *(int *)&(p_t1->mqc).start;
            opj_event_msg(p_manager,2,
                          "PTERM check failure: %d remaining bytes in code block (%d used / %d)\n",
                          (ulong)((iVar39 - iVar16) - 2),(ulong)(uint)(iVar16 - iVar6),
                          (ulong)(uint)(iVar39 - iVar6));
            if (p_manager_mutex != (opj_mutex_t *)0x0) {
LAB_0012f9b8:
              opj_mutex_unlock(p_manager_mutex);
            }
          }
          else if (2 < (p_t1->mqc).end_of_byte_stream_counter) {
            if (p_manager_mutex != (opj_mutex_t *)0x0) {
              opj_mutex_lock(p_manager_mutex);
              opj_event_msg(p_manager,2,"PTERM check failure: %d synthetized 0xFF markers read\n",
                            (ulong)(p_t1->mqc).end_of_byte_stream_counter);
              goto LAB_0012f9b8;
            }
            opj_event_msg(p_manager,2,"PTERM check failure: %d synthetized 0xFF markers read\n");
          }
        }
        if (cblk->decoded_data != (OPJ_INT32 *)0x0) {
          p_t1->data = local_70;
        }
        goto LAB_0012d9bf;
      }
      if (p_manager_mutex == (opj_mutex_t *)0x0) {
        opj_event_msg(p_manager,2,"opj_t1_decode_cblk(): unsupported bpno_plus_one = %d >= 31\n",
                      (ulong)local_f4);
      }
      else {
        opj_mutex_lock(p_manager_mutex);
        opj_event_msg(p_manager,2,"opj_t1_decode_cblk(): unsupported bpno_plus_one = %d >= 31\n",
                      (ulong)local_f4);
        opj_mutex_unlock(p_manager_mutex);
      }
    }
LAB_0012dfe9:
    **(undefined4 **)((long)user_data + 0x30) = 0;
  }
  else {
    OVar15 = opj_t1_ht_decode_cblk
                       (p_t1,cblk,piVar7[4],OVar33,uVar28,p_manager,p_manager_mutex,OVar15);
    if (OVar15 == 0) goto LAB_0012dfe9;
LAB_0012d9bf:
    iVar39 = cblk->x0 - *piVar7;
    if ((piVar7[4] & 1U) != 0) {
      lVar26 = (ulong)(iVar3 - 1) * 0xc0;
      iVar39 = (iVar39 + *(int *)(*(long *)(lVar27 + 0x20) + 8 + lVar26)) -
               *(int *)(*(long *)(lVar27 + 0x20) + lVar26);
    }
    iVar16 = cblk->y0 - piVar7[1];
    if ((piVar7[4] & 2U) != 0) {
      lVar26 = (ulong)(iVar3 - 1) * 0xc0;
      iVar16 = (iVar16 + *(int *)(*(long *)(lVar27 + 0x20) + 0xc + lVar26)) -
               *(int *)(*(long *)(lVar27 + 0x20) + 4 + lVar26);
    }
    pfVar8 = (float *)cblk->decoded_data;
    pfVar19 = pfVar8;
    if (pfVar8 == (float *)0x0) {
      pfVar19 = (float *)p_t1->data;
    }
    uVar28 = p_t1->w;
    uVar48 = (ulong)uVar28;
    uVar32 = p_t1->h;
    uVar47 = (ulong)uVar32;
    iVar3 = *(int *)(lVar37 + 0x328);
    if (iVar3 != 0) {
      if (iVar3 < 0x1f) {
        if (uVar47 != 0) {
          uVar30 = 0;
          uVar41 = 0;
          uVar31 = uVar48;
          uVar36 = uVar30;
          do {
            for (; uVar31 != 0; uVar31 = uVar31 - 1) {
              fVar55 = pfVar19[uVar30];
              fVar35 = (float)-(int)fVar55;
              if (0 < (int)fVar55) {
                fVar35 = fVar55;
              }
              if (1 << ((byte)iVar3 & 0x1f) <= (int)fVar35) {
                fVar35 = (float)((uint)fVar35 >> (*(byte *)(lVar37 + 0x328) & 0x1f));
                fVar23 = (float)-(int)fVar35;
                if (-1 < (int)fVar55) {
                  fVar23 = fVar35;
                }
                pfVar19[uVar30] = fVar23;
              }
              uVar30 = uVar30 + 1;
            }
            uVar41 = uVar41 + 1;
            uVar30 = uVar36 + uVar28;
            uVar31 = uVar48;
            uVar36 = uVar30;
          } while (uVar41 != uVar32);
        }
      }
      else if (uVar47 != 0) {
        uVar30 = 0;
        uVar41 = 0;
        uVar31 = uVar48;
        uVar36 = uVar30;
        do {
          for (; uVar31 != 0; uVar31 = uVar31 - 1) {
            pfVar19[uVar30] = 0.0;
            uVar30 = uVar30 + 1;
          }
          uVar41 = uVar41 + 1;
          uVar30 = uVar36 + uVar28;
          uVar31 = uVar48;
          uVar36 = uVar30;
        } while (uVar41 != uVar32);
      }
    }
    if (pfVar8 == (float *)0x0) {
      if (*(long *)(lVar27 + 0x30) == 0) {
        __assert_fail("(cblk->decoded_data != NULL) || (tilec->data != NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/t1.c"
                      ,0x6de,"void opj_t1_clbl_decode_processor(void *, opj_tls_t *)");
      }
      uVar31 = (ulong)(uint)(iVar4 - iVar5);
      if (*(int *)(lVar37 + 0x14) == 1) {
        if (uVar47 != 0) {
          lVar37 = *(long *)(lVar27 + 0x30) + (long)iVar16 * uVar31 * 4 + (long)iVar39 * 4;
          lVar27 = *(long *)(lVar27 + 0x30) + (long)iVar39 * 4 + (long)iVar16 * uVar31 * 4 + 0xc;
          lVar26 = 0;
          uVar45 = 0;
          do {
            uVar34 = 0;
            iVar3 = (int)lVar26;
            if ((uVar28 & 0xfffffffc) != 0) {
              uVar34 = 0;
              do {
                iVar4 = (int)uVar34;
                fVar55 = pfVar19[iVar3 + iVar4 + 1];
                fVar35 = pfVar19[(uint)(iVar3 + 2 + iVar4)];
                fVar23 = pfVar19[iVar3 + iVar4 + 3];
                *(int *)(lVar27 + -0xc + uVar34 * 4) = (int)pfVar19[(uint)(iVar3 + iVar4)] / 2;
                *(int *)(lVar27 + -8 + uVar34 * 4) = (int)fVar55 / 2;
                *(int *)(lVar27 + -4 + uVar34 * 4) = (int)fVar35 / 2;
                *(int *)(lVar27 + uVar34 * 4) = (int)fVar23 / 2;
                uVar34 = uVar34 + 4;
              } while (uVar34 < (uVar28 & 0xfffffffc));
            }
            if ((uint)uVar34 < uVar28) {
              uVar34 = uVar34 & 0xffffffff;
              do {
                *(int *)(lVar37 + uVar34 * 4) = (int)pfVar19[(uint)(iVar3 + (int)uVar34)] / 2;
                uVar34 = uVar34 + 1;
              } while (uVar48 != uVar34);
            }
            uVar45 = uVar45 + 1;
            lVar27 = lVar27 + uVar31 * 4;
            lVar26 = lVar26 + uVar48;
            lVar37 = lVar37 + uVar31 * 4;
          } while (uVar45 != uVar47);
        }
      }
      else if (uVar47 != 0) {
        fVar55 = (float)piVar7[10];
        lVar27 = (long)iVar16 * uVar31 * 4 + *(long *)(lVar27 + 0x30) + (long)iVar39 * 4;
        uVar30 = 0;
        do {
          if (uVar48 != 0) {
            lVar37 = 0;
            do {
              *(float *)(lVar27 + lVar37 * 4) = (float)(int)*pfVar19 * fVar55 * 0.5;
              pfVar19 = pfVar19 + 1;
              lVar37 = lVar37 + 1;
            } while (uVar28 != (uint)lVar37);
          }
          uVar30 = uVar30 + 1;
          lVar27 = lVar27 + uVar31 * 4;
        } while (uVar30 != uVar32);
      }
    }
    else {
      uVar28 = uVar28 * uVar32;
      if (*(int *)(lVar37 + 0x14) == 1) {
        if (uVar28 != 0) {
          uVar48 = 0;
          do {
            pfVar19[uVar48] = (float)((int)pfVar19[uVar48] / 2);
            uVar48 = uVar48 + 1;
          } while (uVar28 != uVar48);
        }
      }
      else {
        fVar55 = (float)piVar7[10] * 0.5;
        uVar32 = uVar28 & 0xfffffff0;
        if (uVar32 == 0) {
          uVar32 = 0;
        }
        else {
          uVar30 = 0;
          do {
            *pfVar19 = (float)(int)*pfVar19 * fVar55;
            pfVar19[1] = (float)(int)pfVar19[1] * fVar55;
            pfVar19[2] = (float)(int)pfVar19[2] * fVar55;
            pfVar19[3] = (float)(int)pfVar19[3] * fVar55;
            pfVar19[4] = (float)(int)pfVar19[4] * fVar55;
            pfVar19[5] = (float)(int)pfVar19[5] * fVar55;
            pfVar19[6] = (float)(int)pfVar19[6] * fVar55;
            pfVar19[7] = (float)(int)pfVar19[7] * fVar55;
            pfVar19[8] = (float)(int)pfVar19[8] * fVar55;
            pfVar19[9] = (float)(int)pfVar19[9] * fVar55;
            pfVar19[10] = (float)(int)pfVar19[10] * fVar55;
            pfVar19[0xb] = (float)(int)pfVar19[0xb] * fVar55;
            pfVar19[0xc] = (float)(int)pfVar19[0xc] * fVar55;
            pfVar19[0xd] = (float)(int)pfVar19[0xd] * fVar55;
            pfVar19[0xe] = (float)(int)pfVar19[0xe] * fVar55;
            pfVar19[0xf] = (float)(int)pfVar19[0xf] * fVar55;
            pfVar19 = pfVar19 + 0x10;
            uVar30 = uVar30 + 0x10;
          } while (uVar30 < uVar32);
        }
        if (uVar32 <= uVar28 && uVar28 - uVar32 != 0) {
          lVar27 = 0;
          do {
            pfVar19[lVar27] = (float)(int)pfVar19[lVar27] * fVar55;
            lVar27 = lVar27 + 1;
          } while (uVar28 - uVar32 != (int)lVar27);
        }
      }
    }
  }
LAB_0012dff7:
  opj_free(user_data);
  return;
}

Assistant:

static void opj_t1_clbl_decode_processor(void* user_data, opj_tls_t* tls)
{
    opj_tcd_cblk_dec_t* cblk;
    opj_tcd_band_t* band;
    opj_tcd_tilecomp_t* tilec;
    opj_tccp_t* tccp;
    OPJ_INT32* OPJ_RESTRICT datap;
    OPJ_UINT32 cblk_w, cblk_h;
    OPJ_INT32 x, y;
    OPJ_UINT32 i, j;
    opj_t1_cblk_decode_processing_job_t* job;
    opj_t1_t* t1;
    OPJ_UINT32 resno;
    OPJ_UINT32 tile_w;

    job = (opj_t1_cblk_decode_processing_job_t*) user_data;

    cblk = job->cblk;

    if (!job->whole_tile_decoding) {
        cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
        cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);

        cblk->decoded_data = (OPJ_INT32*)opj_aligned_malloc(sizeof(OPJ_INT32) *
                             cblk_w * cblk_h);
        if (cblk->decoded_data == NULL) {
            if (job->p_manager_mutex) {
                opj_mutex_lock(job->p_manager_mutex);
            }
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Cannot allocate cblk->decoded_data\n");
            if (job->p_manager_mutex) {
                opj_mutex_unlock(job->p_manager_mutex);
            }
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
        /* Zero-init required */
        memset(cblk->decoded_data, 0, sizeof(OPJ_INT32) * cblk_w * cblk_h);
    } else if (cblk->decoded_data) {
        /* Not sure if that code path can happen, but better be */
        /* safe than sorry */
        opj_aligned_free(cblk->decoded_data);
        cblk->decoded_data = NULL;
    }

    resno = job->resno;
    band = job->band;
    tilec = job->tilec;
    tccp = job->tccp;
    tile_w = (OPJ_UINT32)(tilec->resolutions[tilec->minimum_num_resolutions - 1].x1
                          -
                          tilec->resolutions[tilec->minimum_num_resolutions - 1].x0);

    if (!*(job->pret)) {
        opj_free(job);
        return;
    }

    t1 = (opj_t1_t*) opj_tls_get(tls, OPJ_TLS_KEY_T1);
    if (t1 == NULL) {
        t1 = opj_t1_create(OPJ_FALSE);
        if (t1 == NULL) {
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Cannot allocate Tier 1 handle\n");
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
        if (!opj_tls_set(tls, OPJ_TLS_KEY_T1, t1, opj_t1_destroy_wrapper)) {
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Unable to set t1 handle as TLS\n");
            opj_t1_destroy(t1);
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
    }
    t1->mustuse_cblkdatabuffer = job->mustuse_cblkdatabuffer;

    if ((tccp->cblksty & J2K_CCP_CBLKSTY_HT) != 0) {
        if (OPJ_FALSE == opj_t1_ht_decode_cblk(
                    t1,
                    cblk,
                    band->bandno,
                    (OPJ_UINT32)tccp->roishift,
                    tccp->cblksty,
                    job->p_manager,
                    job->p_manager_mutex,
                    job->check_pterm)) {
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
    } else {
        if (OPJ_FALSE == opj_t1_decode_cblk(
                    t1,
                    cblk,
                    band->bandno,
                    (OPJ_UINT32)tccp->roishift,
                    tccp->cblksty,
                    job->p_manager,
                    job->p_manager_mutex,
                    job->check_pterm)) {
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
    }

    x = cblk->x0 - band->x0;
    y = cblk->y0 - band->y0;
    if (band->bandno & 1) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        x += pres->x1 - pres->x0;
    }
    if (band->bandno & 2) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        y += pres->y1 - pres->y0;
    }

    datap = cblk->decoded_data ? cblk->decoded_data : t1->data;
    cblk_w = t1->w;
    cblk_h = t1->h;

    if (tccp->roishift) {
        if (tccp->roishift >= 31) {
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    datap[(j * cblk_w) + i] = 0;
                }
            }
        } else {
            OPJ_INT32 thresh = 1 << tccp->roishift;
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    OPJ_INT32 val = datap[(j * cblk_w) + i];
                    OPJ_INT32 mag = abs(val);
                    if (mag >= thresh) {
                        mag >>= tccp->roishift;
                        datap[(j * cblk_w) + i] = val < 0 ? -mag : mag;
                    }
                }
            }
        }
    }

    /* Both can be non NULL if for example decoding a full tile and then */
    /* partially a tile. In which case partial decoding should be the */
    /* priority */
    assert((cblk->decoded_data != NULL) || (tilec->data != NULL));

    if (cblk->decoded_data) {
        OPJ_UINT32 cblk_size = cblk_w * cblk_h;
        if (tccp->qmfbid == 1) {
            for (i = 0; i < cblk_size; ++i) {
                datap[i] /= 2;
            }
        } else {        /* if (tccp->qmfbid == 0) */
            const float stepsize = 0.5f * band->stepsize;
            i = 0;
#ifdef __SSE2__
            {
                const __m128 xmm_stepsize = _mm_set1_ps(stepsize);
                for (; i < (cblk_size & ~15U); i += 16) {
                    __m128 xmm0_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 0)));
                    __m128 xmm1_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 4)));
                    __m128 xmm2_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 8)));
                    __m128 xmm3_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 12)));
                    _mm_store_ps((float*)(datap +  0), _mm_mul_ps(xmm0_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  4), _mm_mul_ps(xmm1_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  8), _mm_mul_ps(xmm2_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap + 12), _mm_mul_ps(xmm3_data, xmm_stepsize));
                    datap += 16;
                }
            }
#endif
            for (; i < cblk_size; ++i) {
                OPJ_FLOAT32 tmp = ((OPJ_FLOAT32)(*datap)) * stepsize;
                memcpy(datap, &tmp, sizeof(tmp));
                datap++;
            }
        }
    } else if (tccp->qmfbid == 1) {
        OPJ_INT32* OPJ_RESTRICT tiledp = &tilec->data[(OPJ_SIZE_T)y * tile_w +
                                                       (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            i = 0;
            for (; i < (cblk_w & ~(OPJ_UINT32)3U); i += 4U) {
                OPJ_INT32 tmp0 = datap[(j * cblk_w) + i + 0U];
                OPJ_INT32 tmp1 = datap[(j * cblk_w) + i + 1U];
                OPJ_INT32 tmp2 = datap[(j * cblk_w) + i + 2U];
                OPJ_INT32 tmp3 = datap[(j * cblk_w) + i + 3U];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 0U] = tmp0 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 1U] = tmp1 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 2U] = tmp2 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 3U] = tmp3 / 2;
            }
            for (; i < cblk_w; ++i) {
                OPJ_INT32 tmp = datap[(j * cblk_w) + i];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i] = tmp / 2;
            }
        }
    } else {        /* if (tccp->qmfbid == 0) */
        const float stepsize = 0.5f * band->stepsize;
        OPJ_FLOAT32* OPJ_RESTRICT tiledp = (OPJ_FLOAT32*) &tilec->data[(OPJ_SIZE_T)y *
                                                         tile_w + (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            OPJ_FLOAT32* OPJ_RESTRICT tiledp2 = tiledp;
            for (i = 0; i < cblk_w; ++i) {
                OPJ_FLOAT32 tmp = (OPJ_FLOAT32) * datap * stepsize;
                *tiledp2 = tmp;
                datap++;
                tiledp2++;
            }
            tiledp += tile_w;
        }
    }

    opj_free(job);
}